

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O2

Cnf_Dat_t * Cnf_DeriveSimple(Aig_Man_t *p,int nOutputs)

{
  int iVar1;
  int iVar2;
  Cnf_Dat_t *pCVar3;
  int **ppiVar4;
  int *piVar5;
  long lVar6;
  void *pvVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  iVar2 = p->nObjs[6] + p->nObjs[5];
  iVar9 = p->nObjs[3] + nOutputs * 3 + 1 + iVar2 * 7;
  iVar2 = p->nObjs[3] + nOutputs + 1 + iVar2 * 3;
  pCVar3 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar3->pMan = p;
  pCVar3->nLiterals = iVar9;
  pCVar3->nClauses = iVar2;
  lVar13 = (long)iVar2;
  ppiVar4 = (int **)malloc(lVar13 * 8 + 8);
  pCVar3->pClauses = ppiVar4;
  lVar10 = (long)iVar9;
  piVar5 = (int *)malloc(lVar10 * 4);
  *ppiVar4 = piVar5;
  ppiVar4[lVar13] = piVar5 + lVar10;
  lVar11 = (long)p->vObjs->nSize;
  piVar5 = (int *)malloc(lVar11 * 4);
  pCVar3->pVarNums = piVar5;
  for (lVar6 = 0; lVar6 < lVar11; lVar6 = lVar6 + 1) {
    piVar5[lVar6] = -1;
  }
  if (nOutputs == 0) {
    iVar2 = 1;
  }
  else {
    iVar9 = 0;
    while( true ) {
      iVar2 = iVar9 + 1;
      if (p->vCos->nSize <= iVar9) break;
      pvVar7 = Vec_PtrEntry(p->vCos,iVar9);
      piVar5[*(int *)((long)pvVar7 + 0x24)] = iVar2;
      iVar9 = iVar2;
    }
  }
  for (iVar9 = 0; iVar9 < p->vObjs->nSize; iVar9 = iVar9 + 1) {
    pvVar7 = Vec_PtrEntry(p->vObjs,iVar9);
    if ((pvVar7 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7)) {
      piVar5[*(int *)((long)pvVar7 + 0x24)] = iVar2;
      iVar2 = iVar2 + 1;
    }
  }
  iVar9 = 0;
  while( true ) {
    if (p->vCis->nSize <= iVar9) break;
    pvVar7 = Vec_PtrEntry(p->vCis,iVar9);
    piVar5[*(int *)((long)pvVar7 + 0x24)] = iVar2 + iVar9;
    iVar9 = iVar9 + 1;
  }
  piVar5[p->pConst1->Id] = iVar2 + iVar9;
  pCVar3->nVars = iVar2 + iVar9 + 1;
  piVar5 = *ppiVar4;
  iVar2 = 0;
  while( true ) {
    iVar9 = p->vObjs->nSize;
    if (iVar9 <= iVar2) break;
    pvVar7 = Vec_PtrEntry(p->vObjs,iVar2);
    if ((pvVar7 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7)) {
      piVar8 = pCVar3->pVarNums;
      iVar9 = piVar8[*(int *)((long)pvVar7 + 0x24)];
      iVar12 = piVar8[*(int *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x24)];
      iVar1 = piVar8[*(int *)((*(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe) + 0x24)];
      *ppiVar4 = piVar5;
      *piVar5 = iVar9 * 2;
      piVar5[1] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar12 * 2 ^ 1;
      piVar5[2] = (*(uint *)((long)pvVar7 + 0x10) & 1) + iVar1 * 2 ^ 1;
      ppiVar4[1] = piVar5 + 3;
      iVar9 = iVar9 * 2 + 1;
      piVar5[3] = iVar9;
      piVar5[4] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar12 * 2;
      ppiVar4[2] = piVar5 + 5;
      ppiVar4 = ppiVar4 + 3;
      piVar5[5] = iVar9;
      piVar5[6] = (*(uint *)((long)pvVar7 + 0x10) & 1) + iVar1 * 2;
      piVar5 = piVar5 + 7;
    }
    iVar2 = iVar2 + 1;
  }
  iVar2 = pCVar3->pVarNums[p->pConst1->Id];
  if (iVar2 <= iVar9) {
    *ppiVar4 = piVar5;
    ppiVar4 = ppiVar4 + 1;
    *piVar5 = iVar2 * 2;
    piVar5 = piVar5 + 1;
    for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
      pvVar7 = Vec_PtrEntry(p->vCos,iVar2);
      iVar9 = pCVar3->pVarNums[*(int *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x24)]
      ;
      if (iVar2 < p->nObjs[3] - nOutputs) {
        piVar8 = piVar5 + 1;
        *ppiVar4 = piVar5;
        ppiVar4 = ppiVar4 + 1;
        iVar12 = (*(uint *)((long)pvVar7 + 8) & 1) + iVar9 * 2;
      }
      else {
        iVar1 = pCVar3->pVarNums[*(int *)((long)pvVar7 + 0x24)];
        *ppiVar4 = piVar5;
        piVar5[1] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar9 * 2 ^ 1;
        ppiVar4[1] = piVar5 + 2;
        ppiVar4 = ppiVar4 + 2;
        iVar12 = iVar1 * 2;
        piVar5[2] = iVar1 * 2 + 1;
        piVar8 = piVar5 + 4;
        piVar5[3] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar9 * 2;
      }
      *piVar5 = iVar12;
      piVar5 = piVar8;
    }
    if ((long)piVar5 - (long)*pCVar3->pClauses >> 2 == lVar10) {
      if ((long)ppiVar4 - (long)pCVar3->pClauses >> 3 == lVar13) {
        return pCVar3;
      }
      __assert_fail("pClas - pCnf->pClauses == nClauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                    ,0x2b4,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
    }
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,0x2b3,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
  }
  __assert_fail("OutVar <= Aig_ManObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                ,0x297,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
}

Assistant:

Cnf_Dat_t * Cnf_DeriveSimple( Aig_Man_t * p, int nOutputs )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    int i, nLiterals, nClauses, Number;

    // count the number of literals and clauses
    nLiterals = 1 + 7 * Aig_ManNodeNum(p) + Aig_ManCoNum( p ) + 3 * nOutputs;
    nClauses = 1 + 3 * Aig_ManNodeNum(p) + Aig_ManCoNum( p ) + nOutputs;

    // allocate CNF
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = p;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;

    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p) );
    for ( i = 0; i < Aig_ManObjNumMax(p); i++ )
        pCnf->pVarNums[i] = -1;
    // assign variables to the last (nOutputs) POs
    Number = 1;
    if ( nOutputs )
    {
//        assert( nOutputs == Aig_ManRegNum(p) );
//        Aig_ManForEachLiSeq( p, pObj, i )
//            pCnf->pVarNums[pObj->Id] = Number++;
        Aig_ManForEachCo( p, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
    }
    // assign variables to the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    pCnf->pVarNums[Aig_ManConst1(p)->Id] = Number++;
    pCnf->nVars = Number;
/*
    // print CNF numbers
    printf( "SAT numbers of each node:\n" );
    Aig_ManForEachObj( p, pObj, i )
        printf( "%d=%d ", pObj->Id, pCnf->pVarNums[pObj->Id] );
    printf( "\n" );
*/
    // assign the clauses
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Aig_ManForEachNode( p, pObj, i )
    {
        OutVar   = pCnf->pVarNums[ pObj->Id ];
        pVars[0] = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        pVars[1] = pCnf->pVarNums[ Aig_ObjFanin1(pObj)->Id ];

        // positive phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar; 
        *pLits++ = 2 * pVars[0] + !Aig_ObjFaninC0(pObj); 
        *pLits++ = 2 * pVars[1] + !Aig_ObjFaninC1(pObj); 
        // negative phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[0] + Aig_ObjFaninC0(pObj); 
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[1] + Aig_ObjFaninC1(pObj); 
    }
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar;  

    // write the output literals
    Aig_ManForEachCo( p, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        if ( i < Aig_ManCoNum(p) - nOutputs )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
        else
        {
            PoVar  = pCnf->pVarNums[ pObj->Id ];
            // first clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar; 
            *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
            // second clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar + 1; 
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
    return pCnf;
}